

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,string *name)

{
  bool bVar1;
  long lVar2;
  Tables *this_00;
  Symbol SVar3;
  string prefix;
  string local_50 [32];
  
  std::__cxx11::string::string((string *)&prefix,(string *)name);
  do {
    lVar2 = std::__cxx11::string::rfind((char)&prefix,0x2e);
    if (lVar2 == -1) {
      if (this->underlay_ == (DescriptorPool *)0x0) {
        bVar1 = false;
      }
      else {
        bVar1 = IsSubSymbolOfBuiltType(this->underlay_,name);
      }
      goto LAB_001ddf58;
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)&prefix);
    std::__cxx11::string::operator=((string *)&prefix,local_50);
    std::__cxx11::string::~string(local_50);
    this_00 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                        (&this->tables_);
    SVar3 = Tables::FindSymbol(this_00,&prefix);
  } while ((SVar3.type == NULL_SYMBOL) || (SVar3.type == PACKAGE));
  bVar1 = true;
LAB_001ddf58:
  std::__cxx11::string::~string((string *)&prefix);
  return bVar1;
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(const string& name) const {
  string prefix = name;
  for (;;) {
    string::size_type dot_pos = prefix.find_last_of('.');
    if (dot_pos == string::npos) {
      break;
    }
    prefix = prefix.substr(0, dot_pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    // If the symbol type is anything other than PACKAGE, then its complete
    // definition is already known.
    if (!symbol.IsNull() && symbol.type != Symbol::PACKAGE) {
      return true;
    }
  }
  if (underlay_ != NULL) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}